

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O2

void __thiscall EPoller::fillActiveChannels(EPoller *this,int numEvents,ChannelList *activeChannels)

{
  const_iterator cVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 local_50 [8];
  shared_ptr<Channel> channel;
  key_type local_34 [2];
  int fd;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)numEvents;
  if (numEvents < 1) {
    uVar2 = uVar3;
  }
  channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)activeChannels;
  while( true ) {
    if (uVar2 * 0xc - uVar3 == 0) {
      return;
    }
    local_34[0] = *(key_type *)
                   ((long)&((this->events_).
                            super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
                            super__Vector_impl_data._M_start)->data + uVar3);
    cVar1 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->channels_)._M_h,local_34);
    if (cVar1.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>.
        _M_cur == (__node_type *)0x0) break;
    std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *)local_50,
               (__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>
                      ._M_cur + 0x10));
    *(int *)((long)local_50 + 0x20) =
         *(int *)((long)&((this->events_).
                          super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
                          super__Vector_impl_data._M_start)->events + uVar3);
    std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::push_back
              ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
               channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
               (value_type *)local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&channel);
    uVar3 = uVar3 + 0xc;
  }
  __assert_fail("it != channels_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                ,0x27,"void EPoller::fillActiveChannels(int, ChannelList *) const");
}

Assistant:

void EPoller::fillActiveChannels(int numEvents, ChannelList* activeChannels) const {
    for(int i = 0; i < numEvents; ++i) {
        int fd = events_[i].data.fd;
        auto it = channels_.find(fd);
        assert(it != channels_.end());
        auto channel = it->second;
        channel->setRevents(events_[i].events);
        activeChannels->push_back(channel);
    } 
}